

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_binary_to_hex(void *data,size_t dlen,char *hex,size_t hlen)

{
  byte bVar1;
  uint8_t c;
  char *dptr;
  size_t n;
  size_t hlen_local;
  char *hex_local;
  size_t dlen_local;
  void *data_local;
  
  dptr = hex;
  for (n = 0; n < dlen && n << 1 < hlen; n = n + 1) {
    bVar1 = *(byte *)((long)data + n);
    if (hex != (char *)0x0) {
      *dptr = "0123456789abcdef"[(int)(uint)bVar1 >> 4];
      dptr[1] = "0123456789abcdef"[(int)(bVar1 & 0xf)];
    }
    dptr = dptr + 2;
  }
  return n << 1;
}

Assistant:

size_t
zt_binary_to_hex(void *data, size_t dlen, char *hex, size_t hlen) {
    size_t n;
    char * dptr = hex;

    for (n = 0; (n < dlen) && ((n * 2) < hlen); n++, dptr += 2) {
        uint8_t c = ((uint8_t *)data)[n];
        if (hex != NULL) {
            dptr[0] = HEX_DIGITS[((c >> 4) & 0xF)];
            dptr[1] = HEX_DIGITS[(c & 0xF)];
        }
    }
    return n * 2;
}